

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_playback.c
# Opt level: O0

void decode_alcCreateContext(void)

{
  uint32 attrcount_00;
  int32 iVar1;
  ALCdevice *device_00;
  ALCint *origattrlist_00;
  ALCcontext *retval_00;
  uint local_25c;
  ALCint *pAStack_258;
  ALCint i;
  ALCint *attrlist;
  uint32 attrcount;
  ALCint *origattrlist;
  ALCdevice *device;
  ALCcontext *retval;
  CallerInfo callerinfo;
  
  IO_ENTRYINFO((CallerInfo *)&retval);
  if (io_failure == 0) {
    device_00 = (ALCdevice *)IO_PTR();
    origattrlist_00 = (ALCint *)IO_PTR();
    attrcount_00 = IO_UINT32();
    pAStack_258 = (ALCint *)0x0;
    if (attrcount_00 != 0) {
      pAStack_258 = (ALCint *)get_ioblob((ulong)attrcount_00 << 2);
      for (local_25c = 0; local_25c < attrcount_00; local_25c = local_25c + 1) {
        iVar1 = IO_INT32();
        pAStack_258[(int)local_25c] = iVar1;
      }
    }
    retval_00 = (ALCcontext *)IO_PTR();
    if (io_failure == 0) {
      visit_alcCreateContext
                ((CallerInfo *)&retval,retval_00,device_00,origattrlist_00,attrcount_00,pAStack_258)
      ;
    }
  }
  return;
}

Assistant:

static void decode_alcCreateContext(void)
{
    IO_START(alcCreateContext);
    ALCcontext *retval;
    ALCdevice *device = (ALCdevice *) IO_PTR();
    ALCint *origattrlist = (ALCint *) IO_PTR();
    const uint32 attrcount = IO_UINT32();
    ALCint *attrlist = NULL;
    if (attrcount) {
        ALCint i;
        attrlist = (ALCint *) get_ioblob(sizeof (ALCint) * attrcount);
        for (i = 0; i < attrcount; i++) {
            attrlist[i] = (ALCint) IO_INT32();
        }
    }
    retval = (ALCcontext *) IO_PTR();

    if (!io_failure) visit_alcCreateContext(&callerinfo, retval, device, origattrlist, attrcount, attrlist);

    IO_END();

}